

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O3

pair<unsigned_long,_unsigned_long>
slang::ast::dynamicBitstreamSize(Type *type,BitstreamSizeMode mode)

{
  SymbolKind SVar1;
  pair<unsigned_long,_unsigned_long> pVar2;
  pair<unsigned_long,_unsigned_long> pVar3;
  pair<unsigned_long,_unsigned_long> pVar4;
  pair<unsigned_long,_unsigned_long> pVar5;
  BitstreamSizeMode BVar6;
  bool bVar7;
  bitwidth_t bVar8;
  Type *pTVar10;
  int iVar9;
  unsigned_long uVar11;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> sVar12;
  unsigned_long uVar13;
  int iVar14;
  char *func;
  _Ct __m2;
  _Ct __m2_1;
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar15;
  _Ct __n2;
  pair<unsigned_long,_unsigned_long> pVar16;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_> iVar17;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>_>
  iVar18;
  specific_symbol_iterator<slang::ast::FieldSymbol> local_38;
  
  bVar8 = Type::getBitWidth(type);
  if (bVar8 != 0) {
    return (pair<unsigned_long,_unsigned_long>)(ZEXT416(bVar8) << 0x40);
  }
  pTVar10 = type->canonical;
  if (pTVar10 == (Type *)0x0) {
    Type::resolveCanonical(type);
    pTVar10 = type->canonical;
  }
  if ((pTVar10->super_Symbol).kind == StringType) {
    uVar13 = (ulong)(mode != DestEmpty) << 3;
  }
  else {
    bVar7 = Type::isUnpackedArray(type);
    if (bVar7) {
      pTVar10 = Type::getArrayElementType(type);
      pVar16 = dynamicBitstreamSize(pTVar10,mode);
      uVar13 = pVar16.second;
      uVar11 = pVar16.first;
      pVar2.second = uVar11;
      pVar2.first = uVar13;
      pTVar10 = type->canonical;
      if (pTVar10 == (Type *)0x0) {
        Type::resolveCanonical(type);
        pTVar10 = type->canonical;
      }
      if ((pTVar10->super_Symbol).kind == FixedSizeUnpackedArrayType) {
        iVar14 = (int)pTVar10[1].super_Symbol.name._M_len -
                 *(int *)((long)&pTVar10[1].super_Symbol.name._M_len + 4);
        iVar9 = -iVar14;
        if (0 < iVar14) {
          iVar9 = iVar14;
        }
        pVar4.second = uVar13 * (iVar9 + 1);
        pVar4.first = uVar11 * (iVar9 + 1);
        return pVar4;
      }
      if (mode == Source) {
        uVar13 = std::__detail::__gcd<unsigned_long>(uVar11,uVar13);
        goto LAB_00220935;
      }
      if (mode == DestFill) {
        if (uVar11 != 0) {
          return pVar16;
        }
        return pVar2;
      }
    }
    else {
      pTVar10 = type->canonical;
      if (pTVar10 == (Type *)0x0) {
        Type::resolveCanonical(type);
        pTVar10 = type->canonical;
      }
      SVar1 = (pTVar10->super_Symbol).kind;
      if (SVar1 == ClassType) {
        iVar18 = Scope::membersOfType<slang::ast::ClassPropertySymbol>((Scope *)(pTVar10 + 1));
        sVar12 = iVar18.m_begin.current;
        if (sVar12.current != iVar18.m_end.current.current) {
          uVar13 = 0;
          uVar11 = 0;
          while ((sVar12.current)->kind == ClassProperty) {
            pTVar10 = DeclaredType::getType((DeclaredType *)(sVar12.current + 1));
            pVar16 = dynamicBitstreamSize(pTVar10,mode);
            uVar11 = std::__detail::__gcd<unsigned_long>(uVar11,pVar16.first);
            do {
              sVar12.current = (sVar12.current)->nextInScope;
              if (sVar12.current == (Symbol *)0x0) {
                sVar12.current = (Symbol *)0x0;
                break;
              }
            } while ((sVar12.current)->kind != ClassProperty);
            uVar13 = uVar13 + pVar16.second;
            pVar16.second = uVar13;
            pVar16.first = uVar11;
            if (sVar12.current == iVar18.m_end.current.current) {
              return pVar16;
            }
          }
          func = "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::ClassPropertySymbol]";
          goto LAB_00220979;
        }
      }
      else if (SVar1 == UnpackedStructType) {
        iVar17 = Scope::membersOfType<slang::ast::FieldSymbol>((Scope *)(pTVar10 + 1));
        uVar11 = 0;
        uVar13 = 0;
        if (iVar17.m_begin.current.current == iVar17.m_end.current.current) goto LAB_00220935;
        uVar13 = 0;
        while( true ) {
          local_38 = iVar17.m_end.current;
          sVar15 = iVar17.m_begin.current;
          if ((sVar15.current)->kind != Field) break;
          pTVar10 = DeclaredType::getType((DeclaredType *)(sVar15.current + 1));
          pVar16 = dynamicBitstreamSize(pTVar10,mode);
          BVar6 = (pVar16.first == 0) + DestEmpty;
          if (mode != DestFill) {
            BVar6 = mode;
          }
          mode = BVar6;
          uVar11 = std::__detail::__gcd<unsigned_long>(uVar11,pVar16.first);
          do {
            sVar15.current = (sVar15.current)->nextInScope;
            if (sVar15.current == (Symbol *)0x0) {
              sVar15.current = (Symbol *)0x0;
              break;
            }
          } while ((sVar15.current)->kind != Field);
          iVar17.m_end.current = local_38.current;
          iVar17.m_begin.current = sVar15.current;
          uVar13 = uVar13 + pVar16.second;
          pVar5.second = uVar13;
          pVar5.first = uVar11;
          if (sVar15.current == local_38.current) {
            return pVar5;
          }
        }
        func = "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::FieldSymbol]";
LAB_00220979:
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                   ,0xc4,func);
      }
    }
    uVar13 = 0;
  }
LAB_00220935:
  pVar3.second = 0;
  pVar3.first = uVar13;
  return pVar3;
}

Assistant:

static std::pair<size_t, size_t> dynamicBitstreamSize(const Type& type, BitstreamSizeMode mode) {
    size_t fixedSize = type.getBitWidth();
    if (fixedSize > 0)
        return {0, fixedSize};

    if (type.isString())
        return {mode == BitstreamSizeMode::DestEmpty ? 0 : CHAR_BIT, 0};

    // TODO: check for overflow
    size_t multiplier = 0;
    if (type.isUnpackedArray()) {
        auto [multiplierElem, fixedSizeElem] = dynamicBitstreamSize(*type.getArrayElementType(),
                                                                    mode);

        const auto& ct = type.getCanonicalType();
        if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType) {
            auto rw = ct.as<FixedSizeUnpackedArrayType>().range.width();
            multiplier = multiplierElem * rw;
            fixedSize = fixedSizeElem * rw;
        }
        else if (mode == BitstreamSizeMode::DestFill) {
            if (!multiplierElem)
                multiplier = fixedSizeElem; // element is fixed size
            else {
                multiplier = multiplierElem; // element is dynamically sized
                fixedSize = fixedSizeElem;
            }
        }
        else if (mode == BitstreamSizeMode::Source) {
            multiplier = std::gcd(multiplierElem, fixedSizeElem);
        }
    }
    else if (type.isUnpackedStruct()) {
        auto& us = type.getCanonicalType().as<UnpackedStructType>();
        for (auto& field : us.membersOfType<FieldSymbol>()) {
            auto [multiplierElem, fixedSizeElem] = dynamicBitstreamSize(field.getType(), mode);
            if (mode == BitstreamSizeMode::DestFill && multiplierElem > 0) {
                // dynamically sized field filled and rest should be empty
                mode = BitstreamSizeMode::DestEmpty;
            }

            multiplier = std::gcd(multiplier, multiplierElem);
            fixedSize += fixedSizeElem;
        }
    }
    else if (type.isClass()) {
        auto& ct = type.getCanonicalType().as<ClassType>();
        for (auto& prop : ct.membersOfType<ClassPropertySymbol>()) {
            auto [multiplierElem, fixedSizeElem] = dynamicBitstreamSize(prop.getType(), mode);
            multiplier = std::gcd(multiplier, multiplierElem);
            fixedSize += fixedSizeElem;
        }
    }

    return {multiplier, fixedSize};
}